

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall coins_tests::ccoins_write::test_method(ccoins_write *this)

{
  long lVar1;
  const_iterator plVar2;
  const_iterator plVar3;
  const_iterator plVar4;
  const_iterator pcVar5;
  const_iterator pcVar6;
  CAmount in_RDI;
  long in_FS_OFFSET;
  char child_flags;
  const_iterator __end4;
  const_iterator __begin4;
  initializer_list<char> *__range4;
  char parent_flags;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<char> *__range3;
  CAmount child_value;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<long> *__range2;
  CAmount parent_value;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<long> *__range1;
  initializer_list<long> *in_stack_ffffffffffffff08;
  undefined1 *in_stack_ffffffffffffff18;
  const_iterator local_d0;
  const_iterator local_b0;
  const_iterator local_90;
  undefined8 in_stack_ffffffffffffff90;
  undefined2 uVar7;
  CAmount in_stack_ffffffffffffff98;
  undefined8 **child_value_00;
  undefined8 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  uVar7 = (undefined2)((ulong)in_stack_ffffffffffffff90 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,
                  (char)((ulong)in_stack_ffffffffffffff90 >> 0x38),
                  (char)((ulong)in_stack_ffffffffffffff90 >> 0x30),child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  CheckWriteCoins(in_RDI,in_stack_ffffffffffffff98,(CAmount)__end2,(char)((ushort)uVar7 >> 8),
                  (char)uVar7,child_value._7_1_);
  local_20 = 0xfffffffffffffffe;
  local_18 = 0xffffffffffffffff;
  local_10 = 100;
  local_48 = &local_20;
  local_40 = 3;
  child_value_00 = &local_48;
  plVar2 = std::initializer_list<long>::begin(in_stack_ffffffffffffff08);
  plVar3 = std::initializer_list<long>::end((initializer_list<long> *)in_stack_ffffffffffffff18);
  for (; plVar2 != plVar3; plVar2 = plVar2 + 1) {
    lVar1 = *plVar2;
    local_38 = 0xfffffffffffffffe;
    local_30 = 0xffffffffffffffff;
    local_28 = 200;
    local_90 = std::initializer_list<long>::begin(in_stack_ffffffffffffff08);
    plVar4 = std::initializer_list<long>::end((initializer_list<long> *)in_stack_ffffffffffffff18);
    for (; local_90 != plVar4; local_90 = local_90 + 1) {
      if (lVar1 == -2) {
        in_stack_ffffffffffffff18 = ABSENT_FLAGS;
      }
      else {
        in_stack_ffffffffffffff18 = FLAGS;
      }
      local_b0 = std::initializer_list<char>::begin
                           ((initializer_list<char> *)in_stack_ffffffffffffff08);
      pcVar5 = std::initializer_list<char>::end((initializer_list<char> *)in_stack_ffffffffffffff18)
      ;
      for (; local_b0 != pcVar5; local_b0 = local_b0 + 1) {
        local_d0 = std::initializer_list<char>::begin
                             ((initializer_list<char> *)in_stack_ffffffffffffff08);
        pcVar6 = std::initializer_list<char>::end
                           ((initializer_list<char> *)in_stack_ffffffffffffff18);
        for (; local_d0 != pcVar6; local_d0 = local_d0 + 1) {
          CheckWriteCoins(in_RDI,(CAmount)child_value_00,(CAmount)__end2,
                          (char)((ulong)plVar2 >> 0x38),(char)((ulong)plVar2 >> 0x30),
                          child_value._7_1_);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_write)
{
    /* Check BatchWrite behavior, flushing one entry from a child cache to a
     * parent cache, and checking the resulting entry in the parent cache
     * after the write.
     *
     *              Parent  Child   Result  Parent       Child        Result
     *              Value   Value   Value   Flags        Flags        Flags
     */
    CheckWriteCoins(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   , NO_ENTRY   );
    CheckWriteCoins(ABSENT, SPENT , SPENT , NO_ENTRY   , DIRTY      , DIRTY      );
    CheckWriteCoins(ABSENT, SPENT , ABSENT, NO_ENTRY   , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(ABSENT, VALUE2, VALUE2, NO_ENTRY   , DIRTY      , DIRTY      );
    CheckWriteCoins(ABSENT, VALUE2, VALUE2, NO_ENTRY   , DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(SPENT , ABSENT, SPENT , 0          , NO_ENTRY   , 0          );
    CheckWriteCoins(SPENT , ABSENT, SPENT , FRESH      , NO_ENTRY   , FRESH      );
    CheckWriteCoins(SPENT , ABSENT, SPENT , DIRTY      , NO_ENTRY   , DIRTY      );
    CheckWriteCoins(SPENT , ABSENT, SPENT , DIRTY|FRESH, NO_ENTRY   , DIRTY|FRESH);
    CheckWriteCoins(SPENT , SPENT , SPENT , 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , SPENT , SPENT , 0          , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , SPENT , ABSENT, FRESH      , DIRTY      , NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , ABSENT, FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, DIRTY      , NO_ENTRY   );
    CheckWriteCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, 0          , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, FRESH      , DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, FRESH      , DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY|FRESH, DIRTY      );
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH, DIRTY|FRESH);
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, 0          , NO_ENTRY   , 0          );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, FRESH      , NO_ENTRY   , FRESH      );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, DIRTY      , NO_ENTRY   , DIRTY      );
    CheckWriteCoins(VALUE1, ABSENT, VALUE1, DIRTY|FRESH, NO_ENTRY   , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, SPENT , SPENT , 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , 0          , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , ABSENT, FRESH      , DIRTY      , NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , DIRTY      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , ABSENT, DIRTY|FRESH, DIRTY      , NO_ENTRY   );
    CheckWriteCoins(VALUE1, SPENT , FAIL  , DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, 0          , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , 0          , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, FRESH      , DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , FRESH      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, DIRTY      , DIRTY      , DIRTY      );
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , DIRTY      , DIRTY|FRESH, NO_ENTRY   );
    CheckWriteCoins(VALUE1, VALUE2, VALUE2, DIRTY|FRESH, DIRTY      , DIRTY|FRESH);
    CheckWriteCoins(VALUE1, VALUE2, FAIL  , DIRTY|FRESH, DIRTY|FRESH, NO_ENTRY   );

    // The checks above omit cases where the child flags are not DIRTY, since
    // they would be too repetitive (the parent cache is never updated in these
    // cases). The loop below covers these cases and makes sure the parent cache
    // is always left unchanged.
    for (const CAmount parent_value : {ABSENT, SPENT, VALUE1})
        for (const CAmount child_value : {ABSENT, SPENT, VALUE2})
            for (const char parent_flags : parent_value == ABSENT ? ABSENT_FLAGS : FLAGS)
                for (const char child_flags : child_value == ABSENT ? ABSENT_FLAGS : CLEAN_FLAGS)
                    CheckWriteCoins(parent_value, child_value, parent_value, parent_flags, child_flags, parent_flags);
}